

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O3

ARKodeSPRKTable arkodeSymplecticMcLachlan3(void)

{
  sunrealtype *psVar1;
  sunrealtype *psVar2;
  ARKodeSPRKTable pAVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  pAVar3 = ARKodeSPRKTable_Alloc(3);
  if (pAVar3 != (ARKodeSPRKTable)0x0) {
    pAVar3->q = 3;
    pAVar3->stages = 3;
    dVar4 = (double)SUNRpowerR(0x3f84530ea9080fc8,0x3fd5555555555555);
    dVar4 = (-0.6666666666666666 - 1.0 / (dVar4 * 9.0)) - dVar4;
    dVar7 = (dVar4 * dVar4 + 1.0) * 0.25;
    dVar6 = dVar4 * -0.5 + 1.0 / (dVar7 * 9.0);
    dVar4 = 0.0;
    if (dVar7 <= 0.0) {
      dVar7 = 0.0;
      if (0.0 < dVar6) {
        if (dVar6 < 0.0) {
          dVar4 = sqrt(dVar6);
          dVar7 = 0.0;
        }
        else {
          dVar4 = SQRT(dVar6);
        }
      }
    }
    else {
      if (dVar7 < 0.0) {
        dVar5 = sqrt(dVar7);
      }
      else {
        dVar5 = SQRT(dVar7);
      }
      dVar4 = 0.0;
      if (0.0 < dVar5 + dVar6) {
        if (dVar7 < 0.0) {
          dVar4 = sqrt(dVar7);
        }
        else {
          dVar4 = SQRT(dVar7);
        }
        dVar6 = dVar6 + dVar4;
        if (dVar6 < 0.0) {
          dVar4 = sqrt(dVar6);
        }
        else {
          dVar4 = SQRT(dVar6);
        }
      }
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar7 = dVar7 * 3.0;
    }
    dVar4 = dVar4 - 1.0 / dVar7;
    psVar1 = pAVar3->a;
    *psVar1 = dVar4;
    dVar7 = dVar4 * -0.5 + 0.25 / dVar4;
    psVar1[1] = dVar7;
    dVar7 = (1.0 - dVar4) - dVar7;
    psVar1[2] = dVar7;
    psVar2 = pAVar3->ahat;
    *psVar2 = dVar7;
    psVar2[1] = psVar1[1];
    psVar2[2] = *psVar1;
  }
  return pAVar3;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticMcLachlan3(void)
{
  sunrealtype w              = SUN_RCONST(0.0);
  sunrealtype y              = SUN_RCONST(0.0);
  sunrealtype z              = SUN_RCONST(0.0);
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(3);
  if (!sprk_table) { return NULL; }

  sprk_table->q      = 3;
  sprk_table->stages = 3;

  z = -SUNRpowerR((SUN_RCONST(2.0) / SUN_RCONST(27.0)) -
                    SUN_RCONST(1.0) /
                      (SUN_RCONST(9.0) * SUNRsqrt(SUN_RCONST(3.0))),
                  SUN_RCONST(1.0) / SUN_RCONST(3.0));
  w = -SUN_RCONST(2.0) / SUN_RCONST(3.0) +
      SUN_RCONST(1.0) / (SUN_RCONST(9.0) * z) + z;
  y                = (SUN_RCONST(1.0) + w * w) / SUN_RCONST(4.0);
  sprk_table->a[0] = SUNRsqrt(SUN_RCONST(1.0) / (SUN_RCONST(9.0) * y) -
                              w / SUN_RCONST(2.0) + SUNRsqrt(y)) -
                     SUN_RCONST(1.0) / (SUN_RCONST(3.0) * SUNRsqrt(y));
  sprk_table->a[1] = SUN_RCONST(0.25) / sprk_table->a[0] -
                     sprk_table->a[0] / SUN_RCONST(2.0);
  sprk_table->a[2]    = SUN_RCONST(1.0) - sprk_table->a[0] - sprk_table->a[1];
  sprk_table->ahat[0] = sprk_table->a[2];
  sprk_table->ahat[1] = sprk_table->a[1];
  sprk_table->ahat[2] = sprk_table->a[0];
  return sprk_table;
}